

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O3

void __thiscall UdpSocketTest::Run(UdpSocketTest *this)

{
  int iVar1;
  uint32_t number;
  uint32_t new_number;
  Address client_addr;
  Address server_addr;
  Socket sock;
  ServerSocket server;
  Selector s;
  int local_3b8;
  int local_3b4 [5];
  undefined4 local_3a0;
  char local_38c [16];
  undefined4 local_37c;
  Address local_368 [3];
  Address local_2f8 [3];
  Selector local_288 [632];
  
  Selector::Selector(local_288,(char *)0x0);
  JetHead::Socket::Socket((Socket *)local_368,false);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)local_2f8,false);
  local_38c[0] = '\x02';
  local_38c[1] = '\0';
  local_38c[2] = '\0';
  local_38c[3] = '\0';
  local_38c[4] = '\0';
  local_38c[5] = '\0';
  local_38c[6] = '\0';
  local_38c[7] = '\0';
  local_37c = 0x10;
  local_3b4[1] = 2;
  local_3b4[2] = 0;
  local_3a0 = 0x10;
  iVar1 = JetHead::ServerSocket::bind(local_2f8);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x5d,"Bind Failed");
  }
  iVar1 = JetHead::Socket::getLocalAddress(local_2f8);
  JetHead::Socket::Address::setAddress(local_38c);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,99,"get local addr failed");
  }
  JetHead::Socket::setSelector((SocketListener *)local_2f8,(Selector *)&this->super_SocketListener);
  iVar1 = JetHead::Socket::connect(local_368);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x6b,"connect failed");
  }
  iVar1 = JetHead::Socket::getLocalAddress(local_368);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x70,"get local addr failed");
  }
  iVar1 = JetHead::Socket::connect(local_2f8);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x75,"server connet failed");
    local_3b8 = 1000;
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x7b,"connect failed");
  }
  else {
    local_3b8 = 1000;
  }
  iVar1 = JetHead::Socket::write(local_368,(int)&local_3b8);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x80,"write failed");
  }
  iVar1 = JetHead::Socket::read(local_368,(int)local_3b4);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x85,"read failed");
  }
  if (local_3b4[0] != local_3b8 + 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x88,"Data Read failed");
  }
  local_3b8 = local_3b4[0] + 1;
  iVar1 = JetHead::Socket::write(local_368,(int)&local_3b8);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x8f,"write failed");
  }
  iVar1 = JetHead::Socket::read(local_368,(int)local_3b4);
  if (local_3b4[0] != local_3b8 + 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x94,"FAILED");
  }
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x97,"write failed");
  }
  this->mTestState = 0;
  JetHead::Socket::close();
  usleep(100000);
  TestCase::TestPassed(&this->super_TestCase);
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)local_2f8);
  JetHead::Socket::~Socket((Socket *)local_368);
  Selector::~Selector(local_288);
  return;
}

Assistant:

void UdpSocketTest::Run()
{	
	LOG_NOTICE( "UDP Test Started" );

	Selector s;

	Socket sock( false );
	ServerSocket server( false );
	Socket::Address server_addr, client_addr;
	
	int res = server.bind( server_addr );

	if ( res < 0 )
		TestFailed( "Bind Failed" );
		
	res = server.getLocalAddress( server_addr );
	server_addr.setAddress( "127.0.0.1" );
	
	if ( res < 0 )
		TestFailed( "get local addr failed" );
	
	LOG_NOTICE( "Server name %s:%d", server_addr.getName(), server_addr.getPort() );
	
	server.setSelector( this, &s );
	res = sock.connect( server_addr );

	if ( res < 0 )
		TestFailed( "connect failed" );
	
	res = sock.getLocalAddress( client_addr );

	if ( res < 0 )
		TestFailed( "get local addr failed" );

	res = server.connect( client_addr );

	if ( res < 0 )
		TestFailed( "server connet failed" );
	
	uint32_t number = 1000;
	uint32_t new_number;
	
	if ( res < 0 )
		TestFailed( "connect failed" );
	
	res = sock.write( &number, 4 );

	if ( res < 0 )
		TestFailed( "write failed" );

	res = sock.read( &new_number, 4 );

	if ( res < 0 )
		TestFailed( "read failed" );

	if ( new_number != number + 1 )
		TestFailed( "Data Read failed" );
	
	number = new_number + 1;
	
	res = sock.write( &number, 4 );

	if ( res < 0 )
		TestFailed( "write failed" );

	res = sock.read( &new_number, 4 );

	if ( new_number != number + 1 )
		TestFailed( "FAILED" );
	
	if ( res < 0 )
		TestFailed( "write failed" );
	
	LOG_NOTICE( "Data sent" );
	
	mTestState = 0;
	
	sock.close();
	usleep( 100000 );
	
	TestPassed();
}